

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void sendfile_cb(uv_fs_t *req)

{
  uv_fs_t *req_local;
  
  if (req != &sendfile_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x2a2,"req == &sendfile_req");
    abort();
  }
  if (sendfile_req.fs_type != UV_FS_SENDFILE) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x2a3,"req->fs_type == UV_FS_SENDFILE");
    abort();
  }
  if (sendfile_req.result != 0x10009) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
            0x2a4,"req->result == 65545");
    abort();
  }
  sendfile_cb_count = sendfile_cb_count + 1;
  uv_fs_req_cleanup(&sendfile_req);
  return;
}

Assistant:

static void sendfile_cb(uv_fs_t* req) {
  ASSERT(req == &sendfile_req);
  ASSERT(req->fs_type == UV_FS_SENDFILE);
  ASSERT(req->result == 65545);
  sendfile_cb_count++;
  uv_fs_req_cleanup(req);
}